

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fiobj_hash.c
# Opt level: O0

size_t fiobj_hash_each1(FIOBJ o,size_t start_at,_func_int_FIOBJ_void_ptr *task,void *arg)

{
  undefined8 uVar1;
  int iVar2;
  size_t sVar3;
  ulong uVar4;
  long *in_FS_OFFSET;
  bool bVar5;
  _func_int_FIOBJ_void_ptr *local_48;
  size_t pos;
  size_t count;
  fio_hash___s *hash;
  FIOBJ old_each_at_key;
  void *arg_local;
  _func_int_FIOBJ_void_ptr *task_local;
  size_t start_at_local;
  FIOBJ o_local;
  
  if ((o == 0) || (sVar3 = fiobj_type_is(o,FIOBJ_T_HASH), sVar3 == 0)) {
    __assert_fail("o && FIOBJ_TYPE_IS(o, FIOBJ_T_HASH)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/1byte2bytes[P]LotteHTTP/facil.io-0.7.3/lib/facil/fiobj/fiobj_hash.c"
                  ,0x4c,"size_t fiobj_hash_each1(FIOBJ, size_t, int (*)(FIOBJ, void *), void *)");
  }
  uVar1 = *(undefined8 *)(*in_FS_OFFSET + -0x288);
  uVar4 = o & 0xfffffffffffffff8;
  pos = 0;
  sVar3 = start_at;
  if (*(ulong *)(uVar4 + 8) == *(ulong *)(uVar4 + 0x18)) {
    while (pos = sVar3, pos < *(ulong *)(uVar4 + 8)) {
      *(undefined8 *)(*in_FS_OFFSET + -0x288) =
           *(undefined8 *)(*(long *)(uVar4 + 0x20) + pos * 0x18 + 8);
      iVar2 = (*task)(*(FIOBJ *)(*(long *)(uVar4 + 0x20) + pos * 0x18 + 0x10),arg);
      if (iVar2 == -1) {
        pos = pos + 1;
        break;
      }
      sVar3 = pos + 1;
    }
  }
  else {
    local_48 = (_func_int_FIOBJ_void_ptr *)0x0;
    task_local = (_func_int_FIOBJ_void_ptr *)start_at;
    while( true ) {
      bVar5 = false;
      if (local_48 < task_local) {
        bVar5 = local_48 < *(_func_int_FIOBJ_void_ptr **)(uVar4 + 0x18);
      }
      if (!bVar5) break;
      if (*(long *)(*(long *)(uVar4 + 0x20) + (long)local_48 * 0x18 + 8) == 0) {
        task_local = task_local + 1;
      }
      else {
        pos = pos + 1;
      }
      local_48 = local_48 + 1;
    }
    for (; local_48 < *(_func_int_FIOBJ_void_ptr **)(uVar4 + 0x18); local_48 = local_48 + 1) {
      if (*(long *)(*(long *)(uVar4 + 0x20) + (long)local_48 * 0x18 + 8) != 0) {
        pos = pos + 1;
        *(undefined8 *)(*in_FS_OFFSET + -0x288) =
             *(undefined8 *)(*(long *)(uVar4 + 0x20) + (long)local_48 * 0x18 + 8);
        iVar2 = (*task)(*(FIOBJ *)(*(long *)(uVar4 + 0x20) + (long)local_48 * 0x18 + 0x10),arg);
        if (iVar2 == -1) break;
      }
    }
  }
  *(undefined8 *)(*in_FS_OFFSET + -0x288) = uVar1;
  return pos;
}

Assistant:

static size_t fiobj_hash_each1(FIOBJ o, size_t start_at,
                               int (*task)(FIOBJ obj, void *arg), void *arg) {
  assert(o && FIOBJ_TYPE_IS(o, FIOBJ_T_HASH));
  FIOBJ old_each_at_key = each_at_key;
  fio_hash___s *hash = &obj2hash(o)->hash;
  size_t count = 0;
  if (hash->count == hash->pos) {
    /* no holes in the hash, we can work as we please. */
    for (count = start_at; count < hash->count; ++count) {
      each_at_key = hash->ordered[count].obj.key;
      if (task((FIOBJ)hash->ordered[count].obj.obj, arg) == -1) {
        ++count;
        goto end;
      }
    }
  } else {
    size_t pos = 0;
    for (; pos < start_at && pos < hash->pos; ++pos) {
      /* counting */
      if (hash->ordered[pos].obj.key == FIOBJ_INVALID)
        ++start_at;
      else
        ++count;
    }
    for (; pos < hash->pos; ++pos) {
      /* performing */
      if (hash->ordered[pos].obj.key == FIOBJ_INVALID)
        continue;
      ++count;
      each_at_key = hash->ordered[pos].obj.key;
      if (task((FIOBJ)hash->ordered[pos].obj.obj, arg) == -1)
        break;
    }
  }
end:
  each_at_key = old_each_at_key;
  return count;
}